

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_166::Applier::visitExpression(Applier *this,Expression *curr)

{
  mapped_type mVar1;
  Module *pMVar2;
  uintptr_t uVar3;
  Index index;
  iterator iVar4;
  mapped_type *pmVar5;
  LocalSet *expression;
  size_type sVar6;
  LocalGet *expression_00;
  key_type *__k;
  Builder local_48;
  Expression *local_40;
  Expression *curr_local;
  
  local_40 = curr;
  iVar4 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&this->requestInfos,&local_40);
  if (iVar4.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
      ._M_cur != (__node_type *)0x0) {
    RequestInfo::validate
              ((RequestInfo *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                      ._M_cur + 0x10));
    if (*(int *)((long)iVar4.
                       super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                       ._M_cur + 0x10) == 0) {
      if (*(long *)((long)iVar4.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                          ._M_cur + 0x18) != 0) {
        __k = (key_type *)
              ((long)iVar4.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                     ._M_cur + 0x18);
        iVar4 = std::
                _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)&this->requestInfos,__k);
        if (iVar4.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        if (*(int *)((long)iVar4.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                           ._M_cur + 0x10) != 0) {
          curr_local = (Expression *)&this->originalLocalMap;
          sVar6 = std::
                  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)curr_local,__k);
          if (sVar6 == 0) {
            __assert_fail("originalLocalMap.count(info.original)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                          ,0x23d,
                          "void wasm::(anonymous namespace)::Applier::visitExpression(Expression *)"
                         );
          }
          pMVar2 = (this->
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   ).
                   super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   .currModule;
          pmVar5 = std::__detail::
                   _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)curr_local,__k);
          mVar1 = *pmVar5;
          uVar3 = (curr->type).id;
          expression_00 = MixedArena::alloc<wasm::LocalGet>(&pMVar2->allocator);
          expression_00->index = mVar1;
          (expression_00->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.
          id = uVar3;
          Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          ::replaceCurrent((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                            *)this,(Expression *)expression_00);
          *(int *)((long)iVar4.
                         super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                         ._M_cur + 0x10) =
               *(int *)((long)iVar4.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                              ._M_cur + 0x10) + -1;
        }
      }
    }
    else {
      index = Builder::addVar((this->
                              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                              ).
                              super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                              .currFunction,(Type)(curr->type).id);
      pmVar5 = std::__detail::
               _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->originalLocalMap,&local_40);
      *pmVar5 = index;
      local_48.wasm =
           (this->
           super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
           ).
           super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
           .currModule;
      expression = Builder::makeLocalTee(&local_48,index,local_40,(Type)(local_40->type).id);
      Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ::replaceCurrent((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        *)this,(Expression *)expression);
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    auto iter = requestInfos.find(curr);
    if (iter == requestInfos.end()) {
      return;
    }

    const auto& info = iter->second;
    info.validate();

    if (info.requests) {
      // We have requests for this value. Add a local and tee the value to
      // there.
      Index local = originalLocalMap[curr] =
        Builder::addVar(getFunction(), curr->type);
      replaceCurrent(
        Builder(*getModule()).makeLocalTee(local, curr, curr->type));
    } else if (info.original) {
      auto& originalInfo = requestInfos.at(info.original);
      if (originalInfo.requests) {
        // This is a valid request of an original value. Get the value from the
        // local.
        assert(originalLocalMap.count(info.original));
        replaceCurrent(
          Builder(*getModule())
            .makeLocalGet(originalLocalMap[info.original], curr->type));
        originalInfo.requests--;
      }
    }
  }